

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u32 sqlite3Utf8Read(uchar **pz)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  
  pbVar2 = *pz;
  *pz = pbVar2 + 1;
  bVar1 = *pbVar2;
  uVar3 = (uint)bVar1;
  if (0xbf < bVar1) {
    uVar3 = (uint)""[bVar1 - 0xc0];
    uVar4 = uVar3 & 0xfffffffe;
    if (uVar3 < 0x80) {
      uVar3 = 0xfffd;
    }
    if (uVar4 == 0xfffe) {
      uVar3 = 0xfffd;
    }
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3Utf8Read(
  const unsigned char **pz    /* Pointer to string from which to read char */
){
  unsigned int c;

  /* Same as READ_UTF8() above but without the zTerm parameter.
  ** For this routine, we assume the UTF8 string is always zero-terminated.
  */
  c = *((*pz)++);
  if( c>=0xc0 ){
    c = sqlite3Utf8Trans1[c-0xc0];
    while( (*(*pz) & 0xc0)==0x80 ){
      c = (c<<6) + (0x3f & *((*pz)++));
    }
    if( c<0x80
        || (c&0xFFFFF800)==0xD800
        || (c&0xFFFFFFFE)==0xFFFE ){  c = 0xFFFD; }
  }
  return c;
}